

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O0

pair<bool,_node_type> string_to_node(string *string)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
  __l;
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  *local_288;
  _Self local_270;
  _Self local_268;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
  local_25a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_259;
  node_type local_258 [31];
  node_type local_239;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  *local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *string_local;
  pair<bool,_node_type> pair;
  
  local_18 = (undefined1  [8])string;
  if (string_to_node(std::__cxx11::string)::table_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    if (iVar2 != 0) {
      local_238 = &local_230;
      local_239 = D;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[2],_node_type,_true>(local_238,(char (*) [2])"D",&local_239);
      local_238 = &local_208;
      local_258[0xb] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P0",local_258 + 0xb);
      local_238 = &local_1e0;
      local_258[10] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"I1",local_258 + 10);
      local_238 = &local_1b8;
      local_258[9] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P1",local_258 + 9);
      local_238 = &local_190;
      local_258[8] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"I2",local_258 + 8);
      local_238 = &local_168;
      local_258[7] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P2",local_258 + 7);
      local_238 = &local_140;
      local_258[6] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"I3",local_258 + 6);
      local_238 = &local_118;
      local_258[5] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P3",local_258 + 5);
      local_238 = &local_f0;
      local_258[4] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"I4",local_258 + 4);
      local_238 = &local_c8;
      local_258[3] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P4",local_258 + 3);
      local_238 = &local_a0;
      local_258[2] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P5",local_258 + 2);
      local_238 = &local_78;
      local_258[1] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P6",local_258 + 1);
      local_238 = &local_50;
      local_258[0] = P7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(local_238,(char (*) [3])"P7",local_258);
      local_28 = &local_230;
      local_20 = 0xd;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
      ::allocator(&local_25a);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
      ::map(&string_to_node(std::__cxx11::string)::table_abi_cxx11_,__l,&local_259,&local_25a);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
      ::~allocator(&local_25a);
      local_288 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
                   *)&local_28;
      do {
        local_288 = local_288 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
        ::~pair(local_288);
      } while (local_288 != &local_230);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
                   ::~map,&string_to_node(std::__cxx11::string)::table_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    }
  }
  std::pair<bool,_node_type>::pair<bool,_node_type,_true>
            ((pair<bool,_node_type> *)((long)&string_local + 6));
  local_268._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
       ::find(&string_to_node(std::__cxx11::string)::table_abi_cxx11_,string);
  local_270._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
       ::end(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
  bVar1 = std::operator==(&local_268,&local_270);
  if (bVar1) {
    string_local._6_2_ = (pair<bool,_node_type>)((ushort)string_local._7_1_ << 8);
  }
  else {
    string_local._6_2_ = (pair<bool,_node_type>)CONCAT11(string_local._7_1_,1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
             ::operator[](&string_to_node(std::__cxx11::string)::table_abi_cxx11_,string);
    string_local._6_2_ = (pair<bool,_node_type>)CONCAT11(*pmVar3,string_local._6_1_);
  }
  return string_local._6_2_;
}

Assistant:

std::pair<bool, node_type> string_to_node(std::string string)
{
    static std::map<std::string, node_type> table = {
        {"D", D},
        {"P0", P0},
        {"I1", I1},
        {"P1", P1},
        {"I2", I2},
        {"P2", P2},
        {"I3", I3},
        {"P3", P3},
        {"I4", I4},
        {"P4", P4},
        {"P5", P5},
        {"P6", P6},
        {"P7", P7},
    };

    std::pair<bool, node_type> pair;
    if(table.find(string) == table.end())
    {
        pair.first = false;
    }
    else
    {
        pair.first = true;
        pair.second = table[string];
    }
    
    return pair;
}